

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdAddConfidentialTxOut
              (void *handle,char *tx_hex_string,char *asset_string,int64_t value_satoshi,
              char *value_commitment,char *address,char *direct_locking_script,char *nonce,
              char **tx_string)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  Amount AVar4;
  allocator local_361;
  Amount local_360;
  void *local_350;
  Script local_348;
  ConfidentialAssetId asset_obj;
  ConfidentialNonce nonce_obj;
  ElementsAddressFactory address_factory;
  ConfidentialValue value;
  ConfidentialTransactionContext ctxc;
  
  local_350 = handle;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    value._vptr_ConfidentialValue = (_func_int **)0x4fbb12;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0xf5;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "CfdAddConfidentialTxOut";
    cfd::core::logger::warn<>((CfdSourceLocation *)&value,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&value,"Failed to parameter. tx is null or empty.",(allocator *)&ctxc);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&value);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (tx_string != (char **)0x0) {
    bVar1 = cfd::capi::IsEmptyString(asset_string);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&value,tx_hex_string,(allocator *)&local_348);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&ctxc,(string *)&value);
      std::__cxx11::string::~string((string *)&value);
      cfd::core::Amount::Amount(&local_360);
      bVar1 = cfd::capi::IsEmptyString(value_commitment);
      if (bVar1) {
        AVar4 = cfd::core::Amount::CreateBySatoshiAmount(value_satoshi);
        local_360.amount_ = AVar4.amount_;
        local_360.ignore_check_ = AVar4.ignore_check_;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_348,value_commitment,(allocator *)&address_factory);
        cfd::core::ConfidentialValue::ConfidentialValue(&value,(string *)&local_348);
        std::__cxx11::string::~string((string *)&local_348);
        bVar1 = cfd::core::ConfidentialValue::HasBlinding(&value);
        if (!bVar1) {
          AVar4 = cfd::core::ConfidentialValue::GetAmount(&value);
          local_360.amount_ = AVar4.amount_;
          local_360.ignore_check_ = AVar4.ignore_check_;
        }
        cfd::core::ConfidentialValue::~ConfidentialValue(&value);
      }
      cfd::ElementsAddressFactory::ElementsAddressFactory(&address_factory);
      std::__cxx11::string::string((string *)&value,asset_string,(allocator *)&local_348);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset_obj,(string *)&value);
      std::__cxx11::string::~string((string *)&value);
      cfd::core::ConfidentialNonce::ConfidentialNonce(&nonce_obj);
      bVar1 = cfd::capi::IsEmptyString(nonce);
      if (!bVar1) {
        std::__cxx11::string::string((string *)&local_348,nonce,&local_361);
        cfd::core::ConfidentialNonce::ConfidentialNonce
                  ((ConfidentialNonce *)&value,(string *)&local_348);
        cfd::core::ConfidentialNonce::operator=(&nonce_obj,(ConfidentialNonce *)&value);
        cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&value);
        std::__cxx11::string::~string((string *)&local_348);
      }
      bVar1 = cfd::capi::IsEmptyString(address);
      if (bVar1) {
        bVar1 = cfd::capi::IsEmptyString(direct_locking_script);
        if (bVar1) {
          bVar1 = cfd::core::operator>(&local_360,0);
          if (bVar1) {
            cfd::ConfidentialTransactionContext::UpdateFeeAmount(&ctxc,&local_360,&asset_obj);
          }
        }
        else {
          std::__cxx11::string::string((string *)&local_348,direct_locking_script,&local_361);
          cfd::core::Script::Script((Script *)&value,(string *)&local_348);
          std::__cxx11::string::~string((string *)&local_348);
          cfd::core::ConfidentialTransaction::AddTxOut
                    (&ctxc.super_ConfidentialTransaction,&local_360,&asset_obj,(Script *)&value,
                     &nonce_obj);
          cfd::core::Script::~Script((Script *)&value);
        }
      }
      else {
        std::__cxx11::string::string((string *)&value,address,(allocator *)&local_348);
        bVar1 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress((string *)&value);
        std::__cxx11::string::~string((string *)&value);
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_348,address,&local_361);
          cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                    ((ElementsConfidentialAddress *)&value,(string *)&local_348);
          std::__cxx11::string::~string((string *)&local_348);
          cfd::ConfidentialTransactionContext::AddTxOut
                    (&ctxc,(ElementsConfidentialAddress *)&value,&local_360,&asset_obj,false);
          cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                    ((ElementsConfidentialAddress *)&value);
        }
        else {
          std::__cxx11::string::string((string *)&local_348,address,&local_361);
          cfd::AddressFactory::GetAddress
                    ((Address *)&value,&address_factory.super_AddressFactory,(string *)&local_348);
          std::__cxx11::string::~string((string *)&local_348);
          cfd::core::Address::GetLockingScript(&local_348,(Address *)&value);
          cfd::core::ConfidentialTransaction::AddTxOut
                    (&ctxc.super_ConfidentialTransaction,&local_360,&asset_obj,&local_348,&nonce_obj
                    );
          cfd::core::Script::~Script(&local_348);
          cfd::core::Address::~Address((Address *)&value);
        }
      }
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                ((string *)&value,(AbstractTransaction *)&ctxc);
      pcVar2 = cfd::capi::CreateString((string *)&value);
      *tx_string = pcVar2;
      std::__cxx11::string::~string((string *)&value);
      cfd::core::ConfidentialNonce::~ConfidentialNonce(&nonce_obj);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset_obj);
      cfd::AddressFactory::~AddressFactory(&address_factory.super_AddressFactory);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&ctxc);
      return 0;
    }
    value._vptr_ConfidentialValue = (_func_int **)0x4fbb12;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x101;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "CfdAddConfidentialTxOut";
    cfd::core::logger::warn<>((CfdSourceLocation *)&value,"asset is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&value,"Failed to parameter. asset is null or empty.",(allocator *)&ctxc);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&value);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  value._vptr_ConfidentialValue = (_func_int **)0x4fbb12;
  value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xfb;
  value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "CfdAddConfidentialTxOut";
  cfd::core::logger::warn<>((CfdSourceLocation *)&value,"tx output is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&value,"Failed to parameter. tx output is null.",(allocator *)&ctxc);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&value);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddConfidentialTxOut(
    void* handle, const char* tx_hex_string, const char* asset_string,
    int64_t value_satoshi, const char* value_commitment, const char* address,
    const char* direct_locking_script, const char* nonce, char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }
    if (IsEmptyString(asset_string)) {
      warn(CFD_LOG_SOURCE, "asset is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null or empty.");
    }

    ConfidentialTransactionContext ctxc(tx_hex_string);

    Amount amount;
    if (IsEmptyString(value_commitment)) {
      amount = Amount::CreateBySatoshiAmount(value_satoshi);
    } else {
      ConfidentialValue value = ConfidentialValue(value_commitment);
      // unconfidential only
      if (!value.HasBlinding()) amount = value.GetAmount();
    }

    // add TxOut
    ElementsAddressFactory address_factory;
    ConfidentialAssetId asset_obj(asset_string);
    ConfidentialNonce nonce_obj;
    if (!IsEmptyString(nonce)) {
      nonce_obj = ConfidentialNonce(nonce);
    }
    if (!IsEmptyString(address)) {
      // const std::string addr(address);
      if (ElementsConfidentialAddress::IsConfidentialAddress(address)) {
        ElementsConfidentialAddress confidential_addr(address);
        ctxc.AddTxOut(confidential_addr, amount, asset_obj, false);
      } else {
        Address addr = address_factory.GetAddress(address);
        ctxc.AddTxOut(amount, asset_obj, addr.GetLockingScript(), nonce_obj);
      }
    } else if (!IsEmptyString(direct_locking_script)) {
      Script script(direct_locking_script);
      ctxc.AddTxOut(amount, asset_obj, script, nonce_obj);
    } else if (amount > 0) {
      // fee
      ctxc.UpdateFeeAmount(amount, asset_obj);
    }

    *tx_string = CreateString(ctxc.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}